

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::SPFForceManager::SPFForceManager(SPFForceManager *this,SimInfo *info)

{
  bool usePBC;
  int nAtoms;
  int nRigidbodies;
  int nCutoffGroups;
  int atomStorageLayout;
  int rigidBodyStorageLayout;
  int cutoffGroupStorageLayout;
  SimInfo *pSVar1;
  SnapshotManager *pSVar2;
  Globals *pGVar3;
  pointer __p;
  pointer __p_00;
  Snapshot *pSVar4;
  __uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> local_38;
  
  ForceManager::ForceManager(&this->super_ForceManager,info);
  (this->super_ForceManager)._vptr_ForceManager = (_func_int **)&PTR__SPFForceManager_002c3a08;
  this->selectedMolecule_ = (Molecule *)0x0;
  this->k_ = 0;
  memset(&this->thermo_,0,0xb1);
  this->deltaLambda_ = 0.0;
  this->potentialSource_ = 0.0;
  this->potentialSink_ = 0.0;
  __p_00 = (pointer)operator_new(8);
  __p_00->info_ = info;
  local_38._M_t.super__Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>.
  super__Head_base<0UL,_OpenMD::Thermo_*,_false>._M_head_impl =
       (tuple<OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>)
       (_Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>)0x0;
  std::__uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::reset
            ((__uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)&this->thermo_
             ,__p_00);
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::~unique_ptr
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)&local_38);
  pSVar1 = (this->super_ForceManager).info_;
  pSVar2 = pSVar1->sman_;
  this->currentSnapshot_ = pSVar2->currentSnapshot_;
  pGVar3 = pSVar1->simParams_;
  this->k_ = *(int *)&(pGVar3->rnemdPars_->SPFScalingPower).super_ParameterBase.field_0x2c;
  nAtoms = pSVar1->nAtoms_;
  nRigidbodies = pSVar1->nRigidBodies_;
  nCutoffGroups = pSVar1->nCutoffGroups_;
  atomStorageLayout = pSVar2->atomStorageLayout_;
  rigidBodyStorageLayout = pSVar2->rigidBodyStorageLayout_;
  cutoffGroupStorageLayout = pSVar2->cutoffGroupStorageLayout_;
  usePBC = (bool)(pGVar3->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  pSVar4 = (Snapshot *)operator_new(0xa98);
  Snapshot::Snapshot(pSVar4,nAtoms,nRigidbodies,nCutoffGroups,atomStorageLayout,
                     rigidBodyStorageLayout,cutoffGroupStorageLayout,usePBC);
  this->temporarySourceSnapshot_ = pSVar4;
  pSVar4 = (Snapshot *)operator_new(0xa98);
  Snapshot::Snapshot(pSVar4,nAtoms,nRigidbodies,nCutoffGroups,atomStorageLayout,
                     rigidBodyStorageLayout,cutoffGroupStorageLayout,usePBC);
  this->temporarySinkSnapshot_ = pSVar4;
  return;
}

Assistant:

SPFForceManager::SPFForceManager(SimInfo* info) :
      ForceManager {info}, potentialSource_ {}, potentialSink_ {} {
    thermo_          = std::make_unique<Thermo>(info);
    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    k_ = info_->getSimParams()->getRNEMDParameters()->getSPFScalingPower();

    int nAtoms        = info_->getNAtoms();
    int nRigidBodies  = info_->getNRigidBodies();
    int nCutoffGroups = info_->getNCutoffGroups();

    int atomStorageLayout = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbStorageLayout =
        info_->getSnapshotManager()->getRigidBodyStorageLayout();
    int cgStorageLayout =
        info_->getSnapshotManager()->getCutoffGroupStorageLayout();

    bool usePBC = info_->getSimParams()->getUsePeriodicBoundaryConditions();

    temporarySourceSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rbStorageLayout, cgStorageLayout, usePBC);

    temporarySinkSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rbStorageLayout, cgStorageLayout, usePBC);
  }